

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FuzzyHammerer.cpp
# Opt level: O2

void FuzzyHammerer::log_overall_statistics
               (size_t cur_round,string *best_mapping_id,size_t best_mapping_num_bitflips,
               size_t num_effective_patterns)

{
  string local_70;
  string local_50;
  allocator<char> local_29;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Fuzzing run finished successfully.",(allocator<char> *)&local_70);
  Logger::log_info(&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Number of generated patterns: %lu",&local_29);
  format_string<unsigned_long>(&local_50,&local_70,cur_round);
  Logger::log_data(&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Number of generated mappings per pattern: %lu",&local_29);
  format_string<unsigned_long>(&local_50,&local_70,program_args.num_address_mappings_per_pattern);
  Logger::log_data(&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Number of tested locations per pattern: %lu",&local_29);
  format_string<unsigned_long>(&local_50,&local_70,program_args.num_dram_locations_per_mapping);
  Logger::log_data(&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Number of effective patterns: %lu",&local_29);
  format_string<unsigned_long>(&local_50,&local_70,num_effective_patterns);
  Logger::log_data(&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Best pattern ID: %s",&local_29);
  format_string<char_const*>(&local_50,&local_70,(best_mapping_id->_M_dataplus)._M_p);
  Logger::log_data(&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Best pattern #bitflips: %ld",&local_29);
  format_string<unsigned_long>(&local_50,&local_70,best_mapping_num_bitflips);
  Logger::log_data(&local_50,true);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void FuzzyHammerer::log_overall_statistics(size_t cur_round, const std::string &best_mapping_id,
                                           size_t best_mapping_num_bitflips, size_t num_effective_patterns) {
  Logger::log_info("Fuzzing run finished successfully.");
  Logger::log_data(format_string("Number of generated patterns: %lu", cur_round));
  Logger::log_data(format_string("Number of generated mappings per pattern: %lu",
      program_args.num_address_mappings_per_pattern));
  Logger::log_data(format_string("Number of tested locations per pattern: %lu",
      program_args.num_dram_locations_per_mapping));
  Logger::log_data(format_string("Number of effective patterns: %lu", num_effective_patterns));
  Logger::log_data(format_string("Best pattern ID: %s", best_mapping_id.c_str()));
  Logger::log_data(format_string("Best pattern #bitflips: %ld", best_mapping_num_bitflips));
}